

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

shared_ptr<Expr> __thiscall Parser::factor(Parser *this)

{
  shared_ptr<Constant> *__r;
  int iVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  shared_ptr<Expr> sVar4;
  allocator<char> local_131;
  string local_130;
  shared_ptr<Id> local_110;
  undefined1 local_100 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  shared_ptr<Token> local_b0;
  undefined1 local_a0 [8];
  shared_ptr<Id> id;
  string s;
  shared_ptr<Constant> local_60;
  undefined4 local_4c;
  shared_ptr<Expr> x;
  Parser *this_local;
  
  std::shared_ptr<Expr>::shared_ptr((shared_ptr<Expr> *)&stack0xffffffffffffffd8);
  peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->look);
  iVar1 = peVar3->tag;
  if (iVar1 == 0x28) {
    move(in_RSI);
    boolean((Parser *)&stack0xffffffffffffffb8);
    std::shared_ptr<Expr>::operator=
              ((shared_ptr<Expr> *)&stack0xffffffffffffffd8,
               (shared_ptr<Expr> *)&stack0xffffffffffffffb8);
    std::shared_ptr<Expr>::~shared_ptr((shared_ptr<Expr> *)&stack0xffffffffffffffb8);
    match(in_RSI,0x29);
    std::shared_ptr<Expr>::shared_ptr
              ((shared_ptr<Expr> *)this,(shared_ptr<Expr> *)&stack0xffffffffffffffd8);
    local_4c = 1;
  }
  else if (iVar1 == 0x106) {
    std::shared_ptr<Expr>::operator=((shared_ptr<Expr> *)&stack0xffffffffffffffd8,&Constant::False);
    move(in_RSI);
    std::shared_ptr<Expr>::shared_ptr
              ((shared_ptr<Expr> *)this,(shared_ptr<Expr> *)&stack0xffffffffffffffd8);
    local_4c = 1;
  }
  else if (iVar1 == 0x108) {
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &in_RSI->look);
    (**peVar3->_vptr_Token)(&id.super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    w = std::__shared_ptr_access<Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Env,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)in_RSI);
    std::shared_ptr<Token>::shared_ptr(&local_b0,&in_RSI->look);
    Env::get((Env *)local_a0,(shared_ptr<Token> *)w);
    std::shared_ptr<Token>::~shared_ptr(&local_b0);
    bVar2 = std::operator==((shared_ptr<Id> *)local_a0,(nullptr_t)0x0);
    if (bVar2) {
      peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &in_RSI->look);
      (**peVar3->_vptr_Token)(local_100 + 0x10);
      std::operator+(&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_100 + 0x10)," undeclared");
      error(in_RSI,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)(local_100 + 0x10));
    }
    move(in_RSI);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &in_RSI->look);
    if (peVar3->tag == 0x5b) {
      std::shared_ptr<Id>::shared_ptr(&local_110,(shared_ptr<Id> *)local_a0);
      offset((Parser *)local_100,(shared_ptr<Id> *)in_RSI);
      std::shared_ptr<Expr>::shared_ptr<Access,void>
                ((shared_ptr<Expr> *)this,(shared_ptr<Access> *)local_100);
      std::shared_ptr<Access>::~shared_ptr((shared_ptr<Access> *)local_100);
      std::shared_ptr<Id>::~shared_ptr(&local_110);
    }
    else {
      std::shared_ptr<Expr>::shared_ptr<Id,void>
                ((shared_ptr<Expr> *)this,(shared_ptr<Id> *)local_a0);
    }
    local_4c = 1;
    std::shared_ptr<Id>::~shared_ptr((shared_ptr<Id> *)local_a0);
    std::__cxx11::string::~string
              ((string *)&id.super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else if (iVar1 == 0x10e) {
    std::make_shared<Constant,std::shared_ptr<Token>&,std::shared_ptr<Type>&>
              ((shared_ptr<Token> *)&local_60,(shared_ptr<Type> *)&in_RSI->look);
    std::shared_ptr<Expr>::operator=((shared_ptr<Expr> *)&stack0xffffffffffffffd8,&local_60);
    std::shared_ptr<Constant>::~shared_ptr(&local_60);
    move(in_RSI);
    std::shared_ptr<Expr>::shared_ptr
              ((shared_ptr<Expr> *)this,(shared_ptr<Expr> *)&stack0xffffffffffffffd8);
    local_4c = 1;
  }
  else if (iVar1 == 0x110) {
    std::make_shared<Constant,std::shared_ptr<Token>&,std::shared_ptr<Type>&>
              ((shared_ptr<Token> *)((long)&s.field_2 + 8),(shared_ptr<Type> *)&in_RSI->look);
    __r = (shared_ptr<Constant> *)((long)&s.field_2 + 8);
    std::shared_ptr<Expr>::operator=((shared_ptr<Expr> *)&stack0xffffffffffffffd8,__r);
    std::shared_ptr<Constant>::~shared_ptr(__r);
    move(in_RSI);
    std::shared_ptr<Expr>::shared_ptr
              ((shared_ptr<Expr> *)this,(shared_ptr<Expr> *)&stack0xffffffffffffffd8);
    local_4c = 1;
  }
  else if (iVar1 == 0x112) {
    std::shared_ptr<Expr>::operator=((shared_ptr<Expr> *)&stack0xffffffffffffffd8,&Constant::True);
    move(in_RSI);
    std::shared_ptr<Expr>::shared_ptr
              ((shared_ptr<Expr> *)this,(shared_ptr<Expr> *)&stack0xffffffffffffffd8);
    local_4c = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"syntax error",&local_131);
    error(in_RSI,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::shared_ptr<Expr>::shared_ptr((shared_ptr<Expr> *)this,(nullptr_t)0x0);
    local_4c = 1;
  }
  std::shared_ptr<Expr>::~shared_ptr((shared_ptr<Expr> *)&stack0xffffffffffffffd8);
  sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Expr>)sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> factor() {
		std::shared_ptr<Expr> x;
		switch (look->tag) {
		case '(':
			move(); x = boolean(); match(')');
			return x;
			break;
		case NUM:
			x = std::make_shared<Constant>(look, Type::Int);
			move(); return x;
			break;
		case REAL:
			x = std::make_shared<Constant>(look, Type::Float);
			move(); return x;
			break;
		case TRUE:
			x = Constant::True;
			move(); return x;
			break;
		case FALSE:
			x = Constant::False;
			move(); return x;
			break;
		case ID:
			{
				std::string s = look->toString();
				std::shared_ptr<Id> id = top->get(look);
				if (id == nullptr) {
					error(look->toString() + " undeclared");
				}
				move();
				if (look->tag != '[') return id;
				else return offset(id);
			}
			break;
		default:
			error("syntax error");
			return nullptr;
			break;
		}
		
		return nullptr;
	}